

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O1

void flatbuffers::php::PhpGenerator::InitializeExisting(StructDef *struct_def,string *code_ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  long *local_48 [2];
  long local_38 [2];
  
  local_88 = &local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,Indent_abi_cxx11_,DAT_003f5cb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_88);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_88);
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  local_88 = &local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,Indent_abi_cxx11_,DAT_003f5cb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_88);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_88);
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  local_88 = &local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,Indent_abi_cxx11_,DAT_003f5cb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_88);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_88);
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,Indent_abi_cxx11_,DAT_003f5cb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)local_48);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_48,
                              (ulong)(struct_def->super_Definition).name._M_dataplus._M_p);
  paVar1 = &local_68.field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_68.field_2._M_allocated_capacity = *psVar3;
    local_68.field_2._8_8_ = plVar2[3];
    local_68._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar3;
    local_68._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_68._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_68);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_78 = *plVar4;
    lStack_70 = plVar2[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar4;
    local_88 = (long *)*plVar2;
  }
  local_80 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_88);
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  local_88 = &local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,Indent_abi_cxx11_,DAT_003f5cb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_88);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_88);
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  local_88 = &local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,Indent_abi_cxx11_,DAT_003f5cb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_88);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_88);
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  local_88 = &local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,Indent_abi_cxx11_,DAT_003f5cb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_88);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_88);
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  std::operator+(&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_68);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_78 = *plVar4;
    lStack_70 = plVar2[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar4;
    local_88 = (long *)*plVar2;
  }
  local_80 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_88);
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_68);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_78 = *plVar4;
    lStack_70 = plVar2[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar4;
    local_88 = (long *)*plVar2;
  }
  local_80 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_88);
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_68);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_78 = *plVar4;
    lStack_70 = plVar2[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar4;
    local_88 = (long *)*plVar2;
  }
  local_80 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_88);
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  local_88 = &local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,Indent_abi_cxx11_,DAT_003f5cb0 + Indent_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_88);
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_88);
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  return;
}

Assistant:

static void InitializeExisting(const StructDef &struct_def,
                                 std::string *code_ptr) {
    std::string &code = *code_ptr;

    code += Indent + "/**\n";
    code += Indent + " * @param int $_i offset\n";
    code += Indent + " * @param ByteBuffer $_bb\n";
    code += Indent + " * @return " + struct_def.name + "\n";
    code += Indent + " **/\n";
    code += Indent + "public function init($_i, ByteBuffer $_bb)\n";
    code += Indent + "{\n";
    code += Indent + Indent + "$this->bb_pos = $_i;\n";
    code += Indent + Indent + "$this->bb = $_bb;\n";
    code += Indent + Indent + "return $this;\n";
    code += Indent + "}\n\n";
  }